

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

Signedness __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::Visit
          (IsGreaterThanZero *this,SERecurrentNode *node)

{
  Signedness __args_1;
  Signedness SVar1;
  SENode *pSVar2;
  Combiner local_40;
  Signedness local_1c;
  SERecurrentNode *pSStack_18;
  Signedness coeff_sign;
  SERecurrentNode *node_local;
  IsGreaterThanZero *this_local;
  
  pSStack_18 = node;
  node_local = (SERecurrentNode *)this;
  pSVar2 = SERecurrentNode::GetCoefficient(node);
  local_1c = Visit(this,pSVar2);
  if (local_1c == kStrictlyNegative) {
    local_1c = kNegative;
  }
  else if (local_1c == kStrictlyPositive) {
    local_1c = kPositive;
  }
  GetAddCombiner(&local_40,this);
  SVar1 = local_1c;
  pSVar2 = SERecurrentNode::GetOffset(pSStack_18);
  __args_1 = Visit(this,pSVar2);
  SVar1 = std::
          function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
          ::operator()(&local_40,SVar1,__args_1);
  std::
  function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
  ::~function(&local_40);
  return SVar1;
}

Assistant:

Signedness Visit(const SERecurrentNode* node) {
    Signedness coeff_sign = Visit(node->GetCoefficient());
    // SERecurrentNode represent an affine expression in the range [0,
    // loop_bound], so the result cannot be strictly positive or negative.
    switch (coeff_sign) {
      default:
        break;
      case Signedness::kStrictlyNegative:
        coeff_sign = Signedness::kNegative;
        break;
      case Signedness::kStrictlyPositive:
        coeff_sign = Signedness::kPositive;
        break;
    }
    return GetAddCombiner()(coeff_sign, Visit(node->GetOffset()));
  }